

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int client_handle_compressed_certificate(ptls_t *tls,ptls_iovec_t message)

{
  uint8_t *puVar1;
  ushort uVar2;
  st_ptls_decompress_certificate_t *psVar3;
  ptls_key_schedule_t *ppVar4;
  ptls_iovec_t pVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  uint8_t *src;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  size_t sVar12;
  uint8_t *puVar13;
  ptls_hash_context_t **pppVar14;
  ptls_iovec_t pVar15;
  int got_certs;
  int local_44;
  uint8_t *local_40;
  ulong uStack_38;
  
  uVar10 = message.len;
  puVar13 = message.base;
  psVar3 = tls->ctx->decompress_certificate;
  if (psVar3 == (st_ptls_decompress_certificate_t *)0x0) {
    iVar8 = 10;
  }
  else {
    iVar8 = 0x32;
    if ((5 < (long)uVar10) && (8 < uVar10)) {
      uVar6 = (uint)puVar13[8] | (uint)puVar13[7] << 8 | (uint)puVar13[6] << 0x10;
      if (uVar6 < 0x10001) {
        uVar2 = *(ushort *)(puVar13 + 4);
        src = (uint8_t *)malloc((ulong)uVar6);
        if (src != (uint8_t *)0x0) {
          iVar7 = iVar8;
          if (2 < uVar10 - 9) {
            lVar9 = 9;
            uVar11 = 0;
            do {
              uVar11 = (ulong)puVar13[lVar9] | uVar11 << 8;
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0xc);
            if (uVar11 <= uVar10 - 0xc) {
              puVar1 = puVar13 + 0xc;
              pVar5.len = uVar11;
              pVar5.base = puVar1;
              pVar15.len._0_4_ = uVar6;
              pVar15.base = src;
              pVar15.len._4_4_ = 0;
              local_40 = puVar1;
              uStack_38 = uVar11;
              iVar7 = (*psVar3->cb)(psVar3,tls,uVar2 << 8 | uVar2 >> 8,pVar15,pVar5);
              if ((iVar7 == 0) && (iVar7 = iVar8, puVar1 + uVar11 == puVar13 + uVar10)) {
                iVar8 = handle_certificate(tls,src,src + uVar6,&local_44);
                iVar7 = 0x2f;
                if (local_44 != 0) {
                  iVar7 = 0;
                }
                if (iVar8 != 0) {
                  iVar7 = iVar8;
                }
                if (iVar7 == 0) {
                  ppVar4 = tls->key_schedule;
                  if (ppVar4->num_hashes != 0) {
                    pppVar14 = &ppVar4->hashes[0].ctx;
                    sVar12 = 0;
                    do {
                      (*(*pppVar14)->update)(*pppVar14,puVar13,uVar10);
                      sVar12 = sVar12 + 1;
                      pppVar14 = pppVar14 + 2;
                    } while (sVar12 != ppVar4->num_hashes);
                  }
                  tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
                  iVar7 = 0x202;
                }
              }
            }
          }
          goto LAB_00114961;
        }
        iVar8 = 0x201;
      }
      else {
        iVar8 = 0x2a;
      }
    }
  }
  src = (uint8_t *)0x0;
  iVar7 = iVar8;
LAB_00114961:
  free(src);
  return iVar7;
}

Assistant:

static int client_handle_compressed_certificate(ptls_t *tls, ptls_iovec_t message)
{
    const uint8_t *src = message.base + PTLS_HANDSHAKE_HEADER_SIZE, *const end = message.base + message.len;
    uint16_t algo;
    uint32_t uncompressed_size;
    uint8_t *uncompressed = NULL;
    int ret;

    if (tls->ctx->decompress_certificate == NULL) {
        ret = PTLS_ALERT_UNEXPECTED_MESSAGE;
        goto Exit;
    }

    /* decode */
    if ((ret = ptls_decode16(&algo, &src, end)) != 0)
        goto Exit;
    if ((ret = ptls_decode24(&uncompressed_size, &src, end)) != 0)
        goto Exit;
    if (uncompressed_size > 65536) { /* TODO find a sensible number */
        ret = PTLS_ALERT_BAD_CERTIFICATE;
        goto Exit;
    }
    if ((uncompressed = malloc(uncompressed_size)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    ptls_decode_block(src, end, 3, {
        if ((ret = tls->ctx->decompress_certificate->cb(tls->ctx->decompress_certificate, tls, algo,
                                                        ptls_iovec_init(uncompressed, uncompressed_size),
                                                        ptls_iovec_init(src, end - src))) != 0)
            goto Exit;
        src = end;
    });

    /* handle */
    if ((ret = client_do_handle_certificate(tls, uncompressed, uncompressed + uncompressed_size)) != 0)
        goto Exit;

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);
    tls->state = PTLS_STATE_CLIENT_EXPECT_CERTIFICATE_VERIFY;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    free(uncompressed);
    return ret;
}